

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O0

cmUVProcessChain __thiscall cmUVProcessChainBuilder::Start(cmUVProcessChainBuilder *this)

{
  bool bVar1;
  pointer pIVar2;
  size_type sVar3;
  const_reference config;
  cmUVProcessChainBuilder *in_RSI;
  ulong local_38;
  size_t i;
  cmUVProcessChainBuilder *this_local;
  cmUVProcessChain *chain;
  
  cmUVProcessChain::cmUVProcessChain((cmUVProcessChain *)this);
  pIVar2 = std::
           unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
           ::operator->((unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                         *)this);
  bVar1 = cmUVProcessChain::InternalData::Prepare(pIVar2,in_RSI);
  if (bVar1) {
    for (local_38 = 0;
        sVar3 = std::
                vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                ::size(&in_RSI->Processes), local_38 < sVar3; local_38 = local_38 + 1) {
      pIVar2 = std::
               unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
               ::operator->((unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                             *)this);
      config = std::
               vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
               ::operator[](&in_RSI->Processes,local_38);
      sVar3 = std::
              vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
              ::size(&in_RSI->Processes);
      cmUVProcessChain::InternalData::SpawnProcess
                (pIVar2,local_38,config,local_38 == 0,local_38 == sVar3 - 1);
    }
    pIVar2 = std::
             unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
             ::operator->((unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                           *)this);
    cmUVProcessChain::InternalData::Finish(pIVar2);
  }
  return (unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
          )(unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
            )this;
}

Assistant:

cmUVProcessChain cmUVProcessChainBuilder::Start() const
{
  cmUVProcessChain chain;

  if (!chain.Data->Prepare(this)) {
    return chain;
  }

  for (std::size_t i = 0; i < this->Processes.size(); i++) {
    chain.Data->SpawnProcess(i, this->Processes[i], i == 0,
                             i == this->Processes.size() - 1);
  }

  chain.Data->Finish();

  return chain;
}